

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  _Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  *p_Var1;
  pointer *ppOVar2;
  pointer pOVar3;
  void *pvVar4;
  TableBuilder *this_00;
  Logger *info_log;
  __pthread_internal_list **pp_Var5;
  pointer pOVar6;
  bool bVar7;
  int iVar8;
  __pthread_internal_list *p_Var9;
  Iterator *pIVar10;
  long lVar11;
  long lVar12;
  undefined4 extraout_var;
  _func_int **pp_Var13;
  Env *pEVar14;
  uint64_t uVar15;
  undefined4 extraout_var_00;
  _func_int *p_Var16;
  long *plVar17;
  char *pcVar18;
  long lVar19;
  Iterator *in_RDX;
  Env *extraout_RDX;
  Env *extraout_RDX_00;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ParsedInternalKey ikey;
  string current_user_key;
  LevelSummaryStorage tmp;
  undefined1 local_118 [56];
  Env *local_e0;
  Env *local_d8;
  uint local_d0;
  _func_int **local_c8;
  Env *pEStack_c0;
  undefined1 local_b8 [16];
  char *local_a8;
  Env *local_a0;
  undefined8 local_40;
  undefined8 local_38;
  
  p_Var9 = (__pthread_internal_list *)(**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  pp_Var13 = in_RDX->_vptr_Iterator;
  Log((Logger *)compact[1].smallest_snapshot,"Compacting %d@%d + %d@%d files",
      (ulong)((long)pp_Var13[0x19] - (long)pp_Var13[0x18]) >> 3,(ulong)*(uint *)pp_Var13,
      (ulong)((long)pp_Var13[0x1c] - (long)pp_Var13[0x1b]) >> 3,(ulong)(*(uint *)pp_Var13 + 1));
  iVar8 = VersionSet::NumLevelFiles
                    ((VersionSet *)
                     compact[8].outputs.
                     super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     *(int *)in_RDX->_vptr_Iterator);
  if (iVar8 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x37e,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1].cleanup_.function != (CleanupFunction)0x0) {
    __assert_fail("compact->builder==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x37f,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  local_40 = p_Var9;
  if (in_RDX[1]._vptr_Iterator != (_func_int **)0x0) {
    __assert_fail("compact->outfile==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x380,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  pOVar3 = compact[7].outputs.
           super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar6 = compact[8].outputs.
           super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  if (pOVar3 != (pointer)&compact[6].total_bytes) {
    pOVar6 = pOVar3;
  }
  (in_RDX->cleanup_).function = (CleanupFunction)pOVar6->file_size;
  local_118._40_8_ = compact + 3;
  port::Mutex::Unlock((Mutex *)local_118._40_8_);
  pIVar10 = VersionSet::MakeInputIterator
                      ((VersionSet *)
                       compact[8].outputs.
                       super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Compaction *)in_RDX->_vptr_Iterator);
  (*pIVar10->_vptr_Iterator[3])(pIVar10);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_118._48_8_ = "";
  local_e0 = (Env *)0x0;
  local_c8 = (_func_int **)local_b8;
  local_118._32_8_ = (_func_int **)0x0;
  pEStack_c0 = (Env *)0x0;
  local_b8[0] = 0;
  pp_Var13 = (this->super_DB)._vptr_DB;
  local_38 = &compact[3].builder;
  local_118._16_8_ = (_func_int **)0xffffffffffffff;
  lVar22 = 0;
  do {
    iVar8 = (*pIVar10->_vptr_Iterator[2])(pIVar10);
    if (((char)iVar8 == '\0') || (compact[3].outfile != (WritableFile *)0x0)) break;
    if (compact[4].total_bytes != 0) {
      lVar11 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      port::Mutex::Lock((Mutex *)local_118._40_8_);
      if (compact[4].builder != (TableBuilder *)0x0) {
        CompactMemTable((DBImpl *)compact);
        port::CondVar::SignalAll((CondVar *)local_38);
      }
      port::Mutex::Unlock((Mutex *)local_118._40_8_);
      lVar12 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      lVar22 = (lVar22 - lVar11) + lVar12;
    }
    iVar8 = (*pIVar10->_vptr_Iterator[8])(pIVar10);
    local_a8 = (char *)CONCAT44(extraout_var,iVar8);
    local_a0 = extraout_RDX;
    bVar7 = Compaction::ShouldStopBefore
                      ((Compaction *)in_RDX->_vptr_Iterator,(Slice *)&stack0xffffffffffffff58);
    if ((bVar7) && (in_RDX[1].cleanup_.function != (CleanupFunction)0x0)) {
      FinishCompactionOutputFile((DBImpl *)local_118,compact,in_RDX);
      if (pp_Var13 != (_func_int **)local_118._0_8_) {
        if (pp_Var13 != (_func_int **)0x0) {
          operator_delete__(pp_Var13);
        }
        if ((_func_int **)local_118._0_8_ == (_func_int **)0x0) {
          pp_Var13 = (_func_int **)0x0;
        }
        else {
          pp_Var13 = (_func_int **)Status::CopyState((char *)local_118._0_8_);
        }
      }
      if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
        operator_delete__((void *)local_118._0_8_);
      }
      if (pp_Var13 == (_func_int **)0x0) goto LAB_001090fe;
LAB_0010935c:
      bVar7 = false;
    }
    else {
LAB_001090fe:
      if (local_a0 < (Env *)0x8) {
LAB_001091d4:
        pEStack_c0 = (Env *)0x0;
        *(char *)local_c8 = '\0';
        local_118._32_8_ = (_func_int **)0x0;
        local_118._16_8_ = (_func_int **)0xffffffffffffff;
        bVar7 = false;
      }
      else {
        uVar21 = *(ulong *)((long)&((Comparator *)((long)local_a8 + -8))->_vptr_Comparator +
                           (long)local_a0);
        local_d0 = (uint)uVar21 & 0xff;
        local_d8 = (Env *)(uVar21 >> 8);
        pEVar14 = local_a0 + -1;
        local_118._48_8_ = local_a8;
        local_e0 = pEVar14;
        if (1 < local_d0) goto LAB_001091d4;
        if ((local_118._32_8_ & 1) == 0) {
LAB_0010916d:
          local_118._32_8_ = CONCAT71((int7)((ulong)pEVar14 >> 8),1);
          std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)pEStack_c0,local_118._48_8_);
          local_118._16_8_ = (_func_int **)0xffffffffffffff;
        }
        else {
          pOVar3 = (compact->outputs).
                   super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_118._0_8_ = local_c8;
          local_118._8_8_ = pEStack_c0;
          pEVar14 = (Env *)(**(code **)(pOVar3->number + 0x10))(pOVar3,local_118 + 0x30,local_118);
          if ((int)pEVar14 != 0) goto LAB_0010916d;
        }
        pEVar14 = (Env *)(in_RDX->cleanup_).function;
        bVar7 = true;
        if (((pEVar14 < (ulong)local_118._16_8_) && (bVar7 = false, local_d0 == 0)) &&
           (local_d8 <= pEVar14)) {
          bVar7 = Compaction::IsBaseLevelForKey
                            ((Compaction *)in_RDX->_vptr_Iterator,(Slice *)(local_118 + 0x30));
        }
        local_118._16_8_ = local_d8;
      }
      if (bVar7 == false) {
        if (in_RDX[1].cleanup_.function == (CleanupFunction)0x0) {
          OpenCompactionOutputFile((DBImpl *)local_118,compact);
          if (pp_Var13 != (_func_int **)local_118._0_8_) {
            if (pp_Var13 != (_func_int **)0x0) {
              operator_delete__(pp_Var13);
            }
            if ((_func_int **)local_118._0_8_ == (_func_int **)0x0) {
              pp_Var13 = (_func_int **)0x0;
            }
            else {
              pp_Var13 = (_func_int **)Status::CopyState((char *)local_118._0_8_);
            }
          }
          if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
            operator_delete__((void *)local_118._0_8_);
          }
          if (pp_Var13 != (_func_int **)0x0) goto LAB_0010935c;
        }
        uVar15 = TableBuilder::NumEntries((TableBuilder *)in_RDX[1].cleanup_.function);
        if (uVar15 == 0) {
          pvVar4 = (in_RDX->cleanup_).arg2;
          std::__cxx11::string::_M_replace
                    ((long)pvVar4 - 0x40,0,*(char **)((long)pvVar4 + -0x38),(ulong)local_a8);
        }
        pvVar4 = (in_RDX->cleanup_).arg2;
        std::__cxx11::string::_M_replace
                  ((long)pvVar4 - 0x20,0,*(char **)((long)pvVar4 + -0x18),(ulong)local_a8);
        this_00 = (TableBuilder *)in_RDX[1].cleanup_.function;
        iVar8 = (*pIVar10->_vptr_Iterator[9])(pIVar10);
        local_118._0_8_ = CONCAT44(extraout_var_00,iVar8);
        local_118._8_8_ = extraout_RDX_00;
        TableBuilder::Add(this_00,(Slice *)&stack0xffffffffffffff58,(Slice *)local_118);
        p_Var16 = (_func_int *)TableBuilder::FileSize((TableBuilder *)in_RDX[1].cleanup_.function);
        if (in_RDX->_vptr_Iterator[1] <= p_Var16) {
          FinishCompactionOutputFile((DBImpl *)local_118,compact,in_RDX);
          if (pp_Var13 != (_func_int **)local_118._0_8_) {
            if (pp_Var13 != (_func_int **)0x0) {
              operator_delete__(pp_Var13);
            }
            if ((_func_int **)local_118._0_8_ == (_func_int **)0x0) {
              pp_Var13 = (_func_int **)0x0;
            }
            else {
              pp_Var13 = (_func_int **)Status::CopyState((char *)local_118._0_8_);
            }
          }
          if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
            operator_delete__((void *)local_118._0_8_);
          }
          if (pp_Var13 != (_func_int **)0x0) goto LAB_0010935c;
        }
      }
      bVar7 = true;
      (*pIVar10->_vptr_Iterator[6])(pIVar10);
    }
  } while (bVar7);
  (this->super_DB)._vptr_DB = pp_Var13;
  if ((pp_Var13 == (_func_int **)0x0) && (compact[3].outfile != (WritableFile *)0x0)) {
    local_a8 = "Deleting DB during compaction";
    local_a0 = (Env *)0x1d;
    local_118._0_8_ = "";
    local_118._8_8_ = (Env *)0x0;
    Status::Status((Status *)(local_118 + 0x18),kIOError,(Slice *)&stack0xffffffffffffff58,
                   (Slice *)local_118);
    if ((Comparator *)local_118._24_8_ != (Comparator *)0x0) {
      if ((Comparator *)local_118._24_8_ == (Comparator *)0x0) {
        pp_Var13 = (_func_int **)0x0;
      }
      else {
        pp_Var13 = (_func_int **)Status::CopyState((char *)local_118._24_8_);
      }
      (this->super_DB)._vptr_DB = pp_Var13;
    }
    if ((Comparator *)local_118._24_8_ != (Comparator *)0x0) {
      operator_delete__((void *)local_118._24_8_);
    }
  }
  if (((this->super_DB)._vptr_DB == (_func_int **)0x0) &&
     (in_RDX[1].cleanup_.function != (CleanupFunction)0x0)) {
    FinishCompactionOutputFile((DBImpl *)&stack0xffffffffffffff58,compact,in_RDX);
    if ((Comparator *)local_a8 != (Comparator *)0x0) {
      if ((Comparator *)local_a8 == (Comparator *)0x0) {
        pp_Var13 = (_func_int **)0x0;
      }
      else {
        pp_Var13 = (_func_int **)Status::CopyState(local_a8);
      }
      (this->super_DB)._vptr_DB = pp_Var13;
    }
    if ((Comparator *)local_a8 != (Comparator *)0x0) {
      operator_delete__(local_a8);
    }
  }
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    (*pIVar10->_vptr_Iterator[10])(&stack0xffffffffffffff58,pIVar10);
    if ((Comparator *)local_a8 != (Comparator *)0x0) {
      if ((Comparator *)local_a8 == (Comparator *)0x0) {
        pp_Var13 = (_func_int **)0x0;
      }
      else {
        pp_Var13 = (_func_int **)Status::CopyState(local_a8);
      }
      (this->super_DB)._vptr_DB = pp_Var13;
    }
    if ((Comparator *)local_a8 != (Comparator *)0x0) {
      operator_delete__(local_a8);
    }
  }
  (*pIVar10->_vptr_Iterator[1])(pIVar10);
  lVar12 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  pp_Var5 = &((__pthread_internal_list *)local_40)->__prev;
  lVar23 = 0;
  lVar11 = 0;
  do {
    p_Var16 = in_RDX->_vptr_Iterator[lVar11 * 3 + 0x18];
    uVar20 = (uint)((ulong)((long)in_RDX->_vptr_Iterator[lVar11 * 3 + 0x19] - (long)p_Var16) >> 3);
    if (0 < (int)uVar20) {
      uVar21 = 0;
      do {
        lVar23 = lVar23 + *(long *)(*(long *)(p_Var16 + uVar21 * 8) + 0x10);
        uVar21 = uVar21 + 1;
      } while ((uVar20 & 0x7fffffff) != uVar21);
    }
    bVar7 = lVar11 == 0;
    lVar11 = lVar11 + 1;
  } while (bVar7);
  pvVar4 = (in_RDX->cleanup_).arg1;
  lVar11 = (long)(in_RDX->cleanup_).arg2 - (long)pvVar4;
  if (lVar11 == 0) {
    lVar11 = 0;
  }
  else {
    lVar19 = (lVar11 >> 4) * -0x3333333333333333;
    lVar19 = lVar19 + (ulong)(lVar19 == 0);
    plVar17 = (long *)((long)pvVar4 + 8);
    lVar11 = 0;
    do {
      lVar11 = lVar11 + *plVar17;
      plVar17 = plVar17 + 10;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  port::Mutex::Lock((Mutex *)local_118._40_8_);
  lVar19 = (long)*(int *)in_RDX->_vptr_Iterator;
  (&compact[9].smallest_snapshot)[lVar19 * 3] =
       (&compact[9].smallest_snapshot)[lVar19 * 3] + (lVar12 - ((long)pp_Var5 + lVar22));
  p_Var1 = &(&compact[9].outputs)[lVar19].
            super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  ;
  (p_Var1->_M_impl).super__Vector_impl_data._M_start =
       (pointer)((long)&((p_Var1->_M_impl).super__Vector_impl_data._M_start)->number + lVar23);
  ppOVar2 = &(&compact[9].outputs)[lVar19].
             super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppOVar2 = (pointer)((long)&(*ppOVar2)->number + lVar11);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    InstallCompactionResults((DBImpl *)&stack0xffffffffffffff58,compact);
    if ((Comparator *)local_a8 != (Comparator *)0x0) {
      if ((Comparator *)local_a8 == (Comparator *)0x0) {
        pp_Var13 = (_func_int **)0x0;
      }
      else {
        pp_Var13 = (_func_int **)Status::CopyState(local_a8);
      }
      (this->super_DB)._vptr_DB = pp_Var13;
    }
    if ((Comparator *)local_a8 != (Comparator *)0x0) {
      operator_delete__(local_a8);
    }
  }
  if ((this->super_DB)._vptr_DB != (_func_int **)0x0) {
    RecordBackgroundError((DBImpl *)compact,(Status *)this);
  }
  info_log = (Logger *)compact[1].smallest_snapshot;
  pcVar18 = VersionSet::LevelSummary
                      ((VersionSet *)
                       compact[8].outputs.
                       super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (LevelSummaryStorage *)&stack0xffffffffffffff58);
  Log(info_log,"compacted to: %s",pcVar18);
  if (local_c8 != (_func_int **)local_b8) {
    operator_delete(local_c8);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState *compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0),
      compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder==NULL);
  assert(compact->outfile==NULL);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->number_;
  }

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  Iterator *input = versions_->MakeInputIterator(compact->compaction);
  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  for (; input->Valid() && !shutting_down_.Acquire_Load();) {
    // Prioritize immutable compaction work
    if (has_imm_.NoBarrier_Load()!=NULL) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_!=NULL) {
        CompactMemTable();
        bg_cv_.SignalAll();  // Wakeup MakeRoomForWrite() if necessary
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder!=NULL) {//
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key,
                                     Slice(current_user_key))!=0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;    // (A)
      } else if (ikey.type==kTypeDeletion &&
          ikey.sequence <= compact->smallest_snapshot &&
          compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder==NULL) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries()==0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.Acquire_Load()) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder!=NULL) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = NULL;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log,
      "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}